

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadSettingsFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,char *filename)

{
  Verbosity VVar1;
  ostream *poVar2;
  size_t sVar3;
  long *plVar4;
  bool bVar5;
  Verbosity old_verbosity;
  int lineNumber;
  Verbosity old_verbosity_2;
  spxifstream file;
  char line [500];
  string local_568;
  undefined1 local_548 [536];
  ios_base local_330 [264];
  allocator local_228 [512];
  
  (*this->_statistics->readingTime->_vptr_Timer[3])();
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],"Loading settings file <",0x17);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    if (filename == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,filename,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],"> . . .\n",8);
    (this->spxout).m_verbosity = VVar1;
  }
  std::__cxx11::string::string((string *)&local_568,filename,local_228);
  zstr::ifstream::ifstream((ifstream *)local_548,&local_568,_S_in,0x100000);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if (((byte)(*(_func_int **)(local_548._0_8_ + -0x18))[(long)(local_548 + 0x20)] & 5) != 0) {
    VVar1 = (this->spxout).m_verbosity;
    if (2 < (int)VVar1) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Error opening settings file.\n",0x1d);
      (this->spxout).m_verbosity = VVar1;
    }
    bVar5 = false;
    goto LAB_0036f05f;
  }
  lineNumber = 1;
  while( true ) {
    std::ios::widen((char)*(_func_int **)(local_548._0_8_ + -0x18) + (char)(ifstream *)local_548);
    plVar4 = (long *)std::istream::getline((char *)local_548,(long)local_228,-0xc);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
    _parseSettingsLine(this,(char *)local_228,lineNumber);
    lineNumber = lineNumber + 1;
  }
  bVar5 = (bool)(((byte)(*(_func_int **)(local_548._0_8_ + -0x18))[(long)(local_548 + 0x20)] & 2) >>
                1);
  if (bVar5 == false) {
    sVar3 = strlen((char *)local_228);
    VVar1 = (this->spxout).m_verbosity;
    if (sVar3 == 499) {
      if (2 < (int)VVar1) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Error reading settings file: line ",0x22);
        std::ostream::operator<<
                  ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],lineNumber);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity]," in settings file exceeds "
                   ,0x1a);
        std::ostream::operator<<
                  ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],0x1f2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[(this->spxout).m_verbosity]," characters.\n",0xd);
LAB_0036f04e:
        (this->spxout).m_verbosity = VVar1;
      }
    }
    else if (2 < (int)VVar1) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Error reading settings file: line ",0x22);
      std::ostream::operator<<
                ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],lineNumber);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],".\n",2);
      goto LAB_0036f04e;
    }
  }
  (*this->_statistics->readingTime->_vptr_Timer[4])();
LAB_0036f05f:
  zstr::ifstream::~ifstream((ifstream *)local_548,&zstr::ifstream::VTT);
  std::ios_base::~ios_base((ios_base *)(local_548 + 0x218));
  return bVar5;
}

Assistant:

bool SoPlexBase<R>::loadSettingsFile(const char* filename)
{
   assert(filename != nullptr);

   // start timing
   _statistics->readingTime->start();

   SPX_MSG_INFO1(spxout, spxout << "Loading settings file <" << filename << "> . . .\n");

   // open file
   spxifstream file(filename);

   if(!file)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error opening settings file.\n");
      return false;
   }

   // read file
   char line[SPX_SET_MAX_LINE_LEN];
   int lineNumber = 0;
   bool readError = false;

   while(true)
   {
      lineNumber++;
      readError = !file.getline(line, sizeof(line));

      if(readError)
         break;

      (void)_parseSettingsLine(line, lineNumber);
   }

   readError = readError && !file.eof();

   if(readError && strlen(line) == SPX_SET_MAX_LINE_LEN - 1)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error reading settings file: line " << lineNumber <<
                    " in settings file exceeds " << SPX_SET_MAX_LINE_LEN - 2 << " characters.\n");
   }
   else if(readError)
   {
      SPX_MSG_INFO1(spxout, spxout << "Error reading settings file: line " << lineNumber << ".\n");
   }

   // stop timing
   _statistics->readingTime->stop();

   return !readError;
}